

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O0

int Sbd_ManDelay(Sbd_Man_t *p)

{
  Gia_Man_t *p_00;
  int iVar1;
  Gia_Obj_t *pObj;
  int local_1c;
  int Delay;
  int Id;
  int i;
  Sbd_Man_t *p_local;
  
  local_1c = 0;
  for (Delay = 0; iVar1 = Vec_IntSize(p->pGia->vCos), Delay < iVar1; Delay = Delay + 1) {
    p_00 = p->pGia;
    pObj = Gia_ManCo(p->pGia,Delay);
    iVar1 = Gia_ObjFaninId0p(p_00,pObj);
    iVar1 = Vec_IntEntry(p->vLutLevs,iVar1);
    local_1c = Abc_MaxInt(local_1c,iVar1);
  }
  return local_1c;
}

Assistant:

int Sbd_ManDelay( Sbd_Man_t * p )
{
    int i, Id, Delay = 0;
    Gia_ManForEachCoDriverId( p->pGia, Id, i )
        Delay = Abc_MaxInt( Delay, Vec_IntEntry(p->vLutLevs, Id) );
    return Delay;
}